

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::~parser(parser *this)

{
  parser *this_local;
  
  if (this->expression_pos_ != (position_stack_node *)0x0) {
    __assert_fail("!expression_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0xf2,"mjs::parser::~parser()");
  }
  if (this->statement_pos_ != (position_stack_node *)0x0) {
    __assert_fail("!statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0xf3,"mjs::parser::~parser()");
  }
  token::~token(&this->current_token_);
  lexer::~lexer(&this->lexer_);
  std::shared_ptr<mjs::source_file>::~shared_ptr(&this->source_);
  return;
}

Assistant:

~parser() {
        assert(!expression_pos_);
        assert(!statement_pos_);
    }